

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void graphics101::bind_textures(TextureVec *textures)

{
  bool bVar1;
  size_type sVar2;
  __shared_ptr *this;
  __shared_ptr_access<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  int local_14;
  int index;
  TextureVec *textures_local;
  
  local_14 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
            ::size(textures);
    if (sVar2 <= (ulong)(long)local_14) break;
    (*gl3wProcs.ptr[1])((ulong)(local_14 + 0x84c0));
    this = (__shared_ptr *)
           std::
           vector<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
           ::operator[](textures,(long)local_14);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this);
    if (bVar1) {
      this_00 = (__shared_ptr_access<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
                   ::operator[](textures,(long)local_14);
      peVar3 = std::
               __shared_ptr_access<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      (*peVar3->_vptr_Texture[2])();
    }
    else {
      std::operator<<((ostream *)&std::cerr,"No texture\n");
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void bind_textures( const TextureVec& textures ) {
    for( int index = 0; index < textures.size(); ++index ) {
        glActiveTexture( GL_TEXTURE0 + index );
        
        // We will have a null pointer if bindable_textures was called
        // with an unknown name.
        if( !textures[index] ) {
            cerr << "No texture\n";
            continue;
        }
        
        textures[index]->bind();
    }
}